

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall BigNum::BigNum(BigNum *this,int i)

{
  string local_50;
  BigNum local_30;
  
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->sign = true;
  std::__cxx11::to_string(&local_50,i);
  BigNum(&local_30,&local_50);
  setBigNum(this,&local_30);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

BigNum(int i) {
        setBigNum(BigNum(std::to_string(i)));
    }